

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.cpp
# Opt level: O1

void SEHCleanupSignals(void)

{
  if (PAL_InitializeChakraCoreCalled) {
    restore_signal(4,&g_previous_sigill);
    restore_signal(5,&g_previous_sigtrap);
    restore_signal(8,&g_previous_sigfpe);
    restore_signal(7,&g_previous_sigbus);
    restore_signal(0xb,&g_previous_sigsegv);
    return;
  }
  abort();
}

Assistant:

void SEHCleanupSignals()
{
    TRACE("Restoring default signal handlers\n");

    restore_signal(SIGILL, &g_previous_sigill);
    restore_signal(SIGTRAP, &g_previous_sigtrap);
    restore_signal(SIGFPE, &g_previous_sigfpe);
    restore_signal(SIGBUS, &g_previous_sigbus);
    restore_signal(SIGSEGV, &g_previous_sigsegv);
}